

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

Node * push(Node *node)

{
  Node **ppNVar1;
  
  if (node == (Node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                  ,0x118,"Node *push(Node *)");
  }
  if (stackPointer < stack + 0x3ff) {
    ppNVar1 = stackPointer + 1;
    stackPointer = stackPointer + 1;
    *ppNVar1 = node;
    return node;
  }
  __assert_fail("stackPointer < stack + 1023",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/3rd/greg/tree.c"
                ,0x119,"Node *push(Node *)");
}

Assistant:

Node *push(Node *node)
{
  assert(node);
  assert(stackPointer < stack + 1023);
#ifdef DEBUG
  dumpStack();  fprintf(stderr, " PUSH ");  Node_print(node);  fprintf(stderr, "\n");
#endif
  return *++stackPointer= node;
}